

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear.cpp
# Opt level: O1

void find_parameter_C(problem *prob,parameter *param,int nr_fold,double start_C,double max_C,
                     double *best_C,double *best_rate)

{
  uint uVar1;
  undefined4 uVar2;
  int iVar3;
  double *pdVar4;
  double *pdVar5;
  double dVar6;
  undefined8 uVar7;
  double dVar8;
  undefined8 uVar9;
  int *piVar10;
  double *pdVar11;
  double dVar12;
  feature_node *pfVar13;
  _func_void_char_ptr *p_Var14;
  int iVar15;
  int iVar16;
  void *__ptr;
  void *__ptr_00;
  void *__ptr_01;
  void *__s;
  void *__ptr_02;
  ulong uVar17;
  long lVar18;
  void *pvVar19;
  model *model_;
  _func_void_char_ptr *p_Var20;
  ulong uVar21;
  long lVar22;
  long lVar23;
  int iVar24;
  int iVar25;
  ulong uVar26;
  long lVar27;
  model *model_ptr;
  ulong uVar28;
  size_t __size;
  bool bVar29;
  double dVar30;
  double dVar31;
  parameter local_78;
  
  uVar1 = prob->l;
  uVar28 = (ulong)uVar1;
  lVar23 = (long)(int)uVar1;
  __ptr = malloc(lVar23 * 4);
  __ptr_00 = malloc(lVar23 * 8);
  __ptr_01 = malloc((long)nr_fold << 5);
  __s = malloc((long)nr_fold * 8);
  if (0 < nr_fold) {
    memset(__s,0,(ulong)(uint)nr_fold << 3);
  }
  p_Var14 = liblinear_print_string;
  uVar7._0_4_ = param->solver_type;
  uVar7._4_4_ = *(undefined4 *)&param->field_0x4;
  dVar8 = param->eps;
  uVar9._0_4_ = param->nr_thread;
  uVar9._4_4_ = param->nr_weight;
  piVar10 = param->weight_label;
  pdVar11 = param->weight;
  dVar12 = param->p;
  uVar26 = (ulong)(uint)nr_fold;
  if ((int)uVar1 < nr_fold) {
    find_parameter_C_cold_1();
    uVar26 = uVar28;
  }
  iVar25 = (int)uVar26;
  __ptr_02 = malloc((long)iVar25 * 4 + 4);
  if (0 < (int)uVar1) {
    uVar17 = 0;
    do {
      *(int *)((long)__ptr + uVar17 * 4) = (int)uVar17;
      uVar17 = uVar17 + 1;
    } while (uVar28 != uVar17);
  }
  if (0 < (int)uVar1) {
    lVar22 = 0;
    do {
      iVar15 = rand();
      lVar18 = iVar15 % (int)uVar28 + lVar22;
      uVar2 = *(undefined4 *)((long)__ptr + lVar22 * 4);
      *(undefined4 *)((long)__ptr + lVar22 * 4) = *(undefined4 *)((long)__ptr + lVar18 * 4);
      *(undefined4 *)((long)__ptr + lVar18 * 4) = uVar2;
      lVar22 = lVar22 + 1;
      uVar28 = uVar28 - 1;
    } while (uVar28 != 0);
  }
  if (-1 < iVar25) {
    iVar15 = 0;
    uVar28 = 0;
    do {
      *(int *)((long)__ptr_02 + uVar28 * 4) = iVar15 / iVar25;
      uVar28 = uVar28 + 1;
      iVar15 = iVar15 + uVar1;
    } while (iVar25 + 1 != uVar28);
  }
  if (0 < iVar25) {
    iVar15 = prob->n;
    uVar28 = 0;
    do {
      iVar3 = *(int *)((long)__ptr_02 + uVar28 * 4);
      iVar24 = *(int *)((long)__ptr_02 + uVar28 * 4 + 4);
      lVar18 = (long)iVar24;
      lVar27 = uVar28 * 0x20;
      *(double *)((long)__ptr_01 + lVar27 + 0x18) = prob->bias;
      *(int *)((long)__ptr_01 + lVar27 + 4) = iVar15;
      iVar16 = (iVar3 - iVar24) + uVar1;
      *(int *)((long)__ptr_01 + lVar27) = iVar16;
      __size = (long)iVar16 << 3;
      pvVar19 = malloc(__size);
      *(void **)((long)__ptr_01 + lVar27 + 0x10) = pvVar19;
      pvVar19 = malloc(__size);
      *(void **)((long)__ptr_01 + lVar27 + 8) = pvVar19;
      lVar22 = 0;
      if (0 < (long)iVar3) {
        do {
          iVar16 = *(int *)((long)__ptr + lVar22 * 4);
          *(feature_node **)(*(long *)((long)__ptr_01 + lVar27 + 0x10) + lVar22 * 8) =
               prob->x[iVar16];
          *(double *)(*(long *)((long)__ptr_01 + lVar27 + 8) + lVar22 * 8) = prob->y[iVar16];
          lVar22 = lVar22 + 1;
        } while (iVar3 != lVar22);
      }
      if (iVar24 < (int)uVar1) {
        do {
          iVar3 = *(int *)((long)__ptr + lVar18 * 4);
          *(feature_node **)(*(long *)((long)__ptr_01 + lVar27 + 0x10) + lVar22 * 8) =
               prob->x[iVar3];
          *(double *)(*(long *)((long)__ptr_01 + lVar27 + 8) + lVar22 * 8) = prob->y[iVar3];
          lVar22 = lVar22 + 1;
          lVar18 = lVar18 + 1;
        } while (lVar23 != lVar18);
      }
      uVar28 = uVar28 + 1;
    } while (uVar28 != uVar26);
  }
  *best_rate = 0.0;
  dVar6 = 0.0;
  if (0.0 < start_C) goto LAB_0010867a;
  iVar15 = prob->l;
  if (0 < (long)iVar15) {
    lVar23 = 0;
    dVar31 = 0.0;
    do {
      dVar6 = 0.0;
      iVar3 = prob->x[lVar23]->index;
      pfVar13 = prob->x[lVar23];
      while (iVar3 != -1) {
        dVar6 = dVar6 + pfVar13->value * pfVar13->value;
        iVar3 = pfVar13[1].index;
        pfVar13 = pfVar13 + 1;
      }
      if (dVar6 <= dVar31) {
        dVar6 = dVar31;
      }
      lVar23 = lVar23 + 1;
      dVar31 = dVar6;
    } while (lVar23 != iVar15);
  }
  if (param->solver_type == 2) {
    iVar15 = iVar15 * 2;
LAB_0010864c:
    dVar6 = 1.0 / (dVar6 * (double)iVar15);
  }
  else {
    if (param->solver_type == 0) goto LAB_0010864c;
    dVar6 = 1.0;
  }
  dVar6 = log(dVar6);
  dVar6 = floor(dVar6 / 0.6931471805599453);
  start_C = exp2(dVar6);
LAB_0010867a:
  p_Var20 = print_string_stdout;
  if (p_Var14 != (_func_void_char_ptr *)0x0) {
    p_Var20 = p_Var14;
  }
  iVar15 = 0;
  dVar6 = start_C;
  do {
    while( true ) {
      if (max_C < dVar6) goto LAB_001089d3;
      liblinear_print_string = print_null;
      if (0 < iVar25) {
        uVar28 = 0;
        do {
          iVar3 = *(int *)((long)__ptr_02 + uVar28 * 4);
          iVar24 = *(int *)((long)__ptr_02 + uVar28 * 4 + 4);
          pdVar4 = *(double **)((long)__s + uVar28 * 8);
          local_78._0_8_ = uVar7;
          local_78.eps = dVar8;
          local_78.C = dVar6;
          local_78._24_8_ = uVar9;
          local_78.weight_label = piVar10;
          local_78.weight = pdVar11;
          local_78.p = dVar12;
          local_78.init_sol = pdVar4;
          model_ = train((problem *)((long)__ptr_01 + uVar28 * 0x20),&local_78);
          iVar16 = model_->nr_class;
          if (iVar16 == 2) {
            iVar16 = 1;
          }
          uVar17 = (long)iVar16 * (long)*(int *)((long)__ptr_01 + uVar28 * 0x20 + 4);
          iVar16 = (int)uVar17;
          if (pdVar4 == (double *)0x0) {
            pvVar19 = malloc(uVar17 * 8);
            *(void **)((long)__s + uVar28 * 8) = pvVar19;
            if (0 < iVar16) {
              pdVar4 = model_->w;
              uVar21 = 0;
              do {
                *(double *)((long)pvVar19 + uVar21 * 8) = pdVar4[uVar21];
                uVar21 = uVar21 + 1;
              } while ((uVar17 & 0xffffffff) != uVar21);
            }
          }
          else if (iVar15 < 0) {
            if (0 < iVar16) {
              pdVar5 = model_->w;
              uVar21 = 0;
              do {
                pdVar4[uVar21] = pdVar5[uVar21];
                uVar21 = uVar21 + 1;
              } while ((uVar17 & 0xffffffff) != uVar21);
            }
          }
          else {
            if (iVar16 < 1) {
              dVar31 = 0.0;
            }
            else {
              pdVar5 = model_->w;
              dVar31 = 0.0;
              uVar21 = 0;
              do {
                dVar30 = pdVar5[uVar21] - pdVar4[uVar21];
                dVar31 = dVar31 + dVar30 * dVar30;
                pdVar4[uVar21] = pdVar5[uVar21];
                uVar21 = uVar21 + 1;
              } while ((uVar17 & 0xffffffff) != uVar21);
            }
            if (dVar31 < 0.0) {
              dVar31 = sqrt(dVar31);
            }
            else {
              dVar31 = SQRT(dVar31);
            }
            if (1e-15 < dVar31) {
              iVar15 = -1;
            }
          }
          if (iVar3 < iVar24) {
            lVar23 = 0;
            do {
              lVar22 = (long)*(int *)((long)__ptr + lVar23 * 4 + (long)iVar3 * 4);
              dVar31 = predict(model_,prob->x[lVar22]);
              *(double *)((long)__ptr_00 + lVar22 * 8) = dVar31;
              lVar23 = lVar23 + 1;
            } while (iVar24 - iVar3 != (int)lVar23);
          }
          if (model_ != (model *)0x0) {
            free_model_content(model_);
            free(model_);
          }
          uVar28 = uVar28 + 1;
        } while (uVar28 != uVar26);
      }
      iVar3 = prob->l;
      if ((long)iVar3 < 1) {
        dVar31 = 0.0;
      }
      else {
        lVar23 = 0;
        iVar24 = 0;
        do {
          iVar24 = iVar24 + (uint)(prob->y[lVar23] == *(double *)((long)__ptr_00 + lVar23 * 8));
          lVar23 = lVar23 + 1;
        } while (iVar3 != lVar23);
        dVar31 = (double)iVar24;
      }
      dVar31 = dVar31 / (double)iVar3;
      liblinear_print_string = p_Var20;
      if (*best_rate <= dVar31 && dVar31 != *best_rate) {
        *best_C = dVar6;
        *best_rate = dVar31;
      }
      dVar30 = log(dVar6);
      info("log2c=%7.2f\trate=%g\n",SUB84(dVar30 / 0.6931471805599453,0),SUB84(dVar31 * 100.0,0));
      iVar15 = iVar15 + 1;
      bVar29 = iVar15 != 3;
      if (bVar29) break;
      if (!bVar29) goto LAB_001089d3;
    }
    dVar6 = dVar6 + dVar6;
  } while (bVar29);
LAB_001089d3:
  if ((start_C < max_C) && (max_C < dVar6)) {
    info("warning: maximum C reached.\n");
  }
  free(__ptr_02);
  free(__ptr);
  free(__ptr_00);
  if (0 < iVar25) {
    lVar23 = 0;
    do {
      free(*(void **)((long)__ptr_01 + lVar23 * 4 + 0x10));
      free(*(void **)((long)__ptr_01 + lVar23 * 4 + 8));
      free(*(void **)((long)__s + lVar23));
      lVar23 = lVar23 + 8;
    } while (uVar26 * 8 != lVar23);
  }
  free(__s);
  free(__ptr_01);
  return;
}

Assistant:

void find_parameter_C(const problem *prob, const parameter *param, int nr_fold, double start_C, double max_C, double *best_C, double *best_rate)
{
	// variables for CV
	int i;
	int *fold_start;
	int l = prob->l;
	int *perm = Malloc(int, l);
	double *target = Malloc(double, prob->l);
	struct problem *subprob = Malloc(problem,nr_fold);

	// variables for warm start
	double ratio = 2;
	double **prev_w = Malloc(double*, nr_fold);
	for(i = 0; i < nr_fold; i++)
		prev_w[i] = NULL;
	int num_unchanged_w = 0;
	struct parameter param1 = *param;
	void (*default_print_string) (const char *) = liblinear_print_string;

	if (nr_fold > l)
	{
		nr_fold = l;
		fprintf(stderr,"WARNING: # folds > # data. Will use # folds = # data instead (i.e., leave-one-out cross validation)\n");
	}
	fold_start = Malloc(int,nr_fold+1);
	for(i=0;i<l;i++) perm[i]=i;
	for(i=0;i<l;i++)
	{
		int j = i+rand()%(l-i);
		swap(perm[i],perm[j]);
	}
	for(i=0;i<=nr_fold;i++)
		fold_start[i]=i*l/nr_fold;

	for(i=0;i<nr_fold;i++)
	{
		int begin = fold_start[i];
		int end = fold_start[i+1];
		int j,k;

		subprob[i].bias = prob->bias;
		subprob[i].n = prob->n;
		subprob[i].l = l-(end-begin);
		subprob[i].x = Malloc(struct feature_node*,subprob[i].l);
		subprob[i].y = Malloc(double,subprob[i].l);

		k=0;
		for(j=0;j<begin;j++)
		{
			subprob[i].x[k] = prob->x[perm[j]];
			subprob[i].y[k] = prob->y[perm[j]];
			++k;
		}
		for(j=end;j<l;j++)
		{
			subprob[i].x[k] = prob->x[perm[j]];
			subprob[i].y[k] = prob->y[perm[j]];
			++k;
		}

	}

	*best_rate = 0;
	if(start_C <= 0)
		start_C = calc_start_C(prob,param);
	param1.C = start_C;

	while(param1.C <= max_C)
	{
		//Output diabled for running CV at a particular C
		set_print_string_function(&print_null);

#ifdef CV_OMP
#pragma omp parallel for private(i) schedule(dynamic)
#endif
		for(i=0; i<nr_fold; i++)
		{
			int j;
			int begin = fold_start[i];
			int end = fold_start[i+1];

			struct parameter param_t = param1;
			param_t.init_sol = prev_w[i];
			struct model *submodel = train(&subprob[i],&param_t);

			int total_w_size;
			if(submodel->nr_class == 2)
				total_w_size = subprob[i].n;
			else
				total_w_size = subprob[i].n * submodel->nr_class;

			if(prev_w[i] == NULL)
			{
				prev_w[i] = Malloc(double, total_w_size);
				for(j=0; j<total_w_size; j++)
					prev_w[i][j] = submodel->w[j];
			}
			else if(num_unchanged_w >= 0)
			{
				double norm_w_diff = 0;
				for(j=0; j<total_w_size; j++)
				{
					norm_w_diff += (submodel->w[j] - prev_w[i][j])*(submodel->w[j] - prev_w[i][j]);
					prev_w[i][j] = submodel->w[j];
				}
				norm_w_diff = sqrt(norm_w_diff);

				if(norm_w_diff > 1e-15)
					num_unchanged_w = -1;
			}
			else
			{
				for(j=0; j<total_w_size; j++)
					prev_w[i][j] = submodel->w[j];
			}

			for(j=begin; j<end; j++)
				target[perm[j]] = predict(submodel,prob->x[perm[j]]);

			free_and_destroy_model(&submodel);
		}
		set_print_string_function(default_print_string);

		int total_correct = 0;
		for(i=0; i<prob->l; i++)
			if(target[i] == prob->y[i])
				++total_correct;
		double current_rate = (double)total_correct/prob->l;
		if(current_rate > *best_rate)
		{
			*best_C = param1.C;
			*best_rate = current_rate;
		}

		info("log2c=%7.2f\trate=%g\n",log(param1.C)/log(2.0),100.0*current_rate);
		num_unchanged_w++;
		if(num_unchanged_w == 3)
			break;
		param1.C = param1.C*ratio;
	}

	if(param1.C > max_C && max_C > start_C) 
		info("warning: maximum C reached.\n");
	free(fold_start);
	free(perm);
	free(target);
	for(i=0; i<nr_fold; i++)
	{
		free(subprob[i].x);
		free(subprob[i].y);
		free(prev_w[i]);
	}
	free(prev_w);
	free(subprob);
}